

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Freight_train.cpp
# Opt level: O2

void __thiscall Freight_train::set_weight_of_freight(Freight_train *this)

{
  ostream *poVar1;
  
  std::operator<<((ostream *)&std::cout,"Enter weight of freight: ");
  while( true ) {
    std::istream::operator>>((istream *)&std::cin,&this->weight_of_freight);
    if ((((&char*::typeinfo)[*(long *)(std::cin + -0x18)] & 5) == 0) &&
       (this->weight_of_freight != 0)) break;
    std::ios::clear((int)*(long *)(std::cin + -0x18) + 0x108158);
    std::istream::ignore((long)&std::cin,-1);
    poVar1 = std::operator<<((ostream *)&std::cout,"Your input data is incorrect, try again");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return;
}

Assistant:

void Freight_train::set_weight_of_freight() {
    std::cout << "Enter weight of freight: ";
    std::cin >> weight_of_freight;
    while (std::cin.fail() || weight_of_freight == 0) {
        std::cin.clear();
        std::cin.ignore(numeric_limits<streamsize>::max(), '\n');
        std::cout << "Your input data is incorrect, try again" << std::endl;
        std::cin >> weight_of_freight;
    }
}